

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

CompressionFunction * duckdb::GetBitpackingFunction<unsigned_char,true>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_BITPACKING;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = BitpackingInitAnalyze<unsigned_char>;
  in_RDI->analyze = BitpackingAnalyze<unsigned_char>;
  in_RDI->final_analyze = BitpackingFinalAnalyze<unsigned_char>;
  in_RDI->init_compression = BitpackingInitCompression<unsigned_char,true>;
  in_RDI->compress = BitpackingCompress<unsigned_char,true>;
  in_RDI->compress_finalize = BitpackingFinalizeCompress<unsigned_char,true>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = BitpackingInitScan<unsigned_char>;
  in_RDI->scan_vector = BitpackingScan<unsigned_char>;
  in_RDI->scan_partial = BitpackingScanPartial<unsigned_char,signed_char,unsigned_char>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = BitpackingFetchRow<unsigned_char>;
  in_RDI->skip = BitpackingSkip<unsigned_char>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  in_RDI->get_segment_info = BitpackingGetSegmentInfo<unsigned_char>;
  return in_RDI;
}

Assistant:

CompressionFunction GetBitpackingFunction(PhysicalType data_type) {
	auto bitpacking = CompressionFunction(
	    CompressionType::COMPRESSION_BITPACKING, data_type, BitpackingInitAnalyze<T>, BitpackingAnalyze<T>,
	    BitpackingFinalAnalyze<T>, BitpackingInitCompression<T, WRITE_STATISTICS>,
	    BitpackingCompress<T, WRITE_STATISTICS>, BitpackingFinalizeCompress<T, WRITE_STATISTICS>, BitpackingInitScan<T>,
	    BitpackingScan<T>, BitpackingScanPartial<T>, BitpackingFetchRow<T>, BitpackingSkip<T>);
	bitpacking.get_segment_info = BitpackingGetSegmentInfo<T>;
	return bitpacking;
}